

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManMappingVerify_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_00213bed:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar9 = ((long)pObj - (long)pGVar1 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar9;
  if (p->nTravIdsAlloc <= (int)uVar8) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar3 = 1;
  if (p->pTravIds[(int)uVar8] != p->nTravIds) {
    p->pTravIds[(int)uVar8] = p->nTravIds;
    uVar5 = (uint)*(undefined8 *)pObj;
    if (((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) &&
       ((((uint)((ulong)*(undefined8 *)pObj >> 0x20) ^ uVar5) & 0x1fffffff) != 0)) {
      if (pObj < pGVar1 + p->nObjs) {
        if (-1 < (int)uVar8) {
          pVVar4 = p->vMapping;
          uVar5 = pVVar4->nSize;
          if ((int)uVar8 < (int)uVar5) {
            if (pVVar4->pArray[uVar8 & 0x7fffffff] == 0) {
              Abc_Print(-1,"Gia_ManMappingVerify: Internal node %d does not have mapping.\n",
                        uVar9 & 0xffffffff);
              return 0;
            }
            lVar7 = 0;
            do {
              piVar2 = pVVar4->pArray;
              lVar6 = (long)piVar2[uVar8 & 0x7fffffff];
              if ((lVar6 < 0) || (uVar5 <= (uint)piVar2[uVar8 & 0x7fffffff])) break;
              if (piVar2[lVar6] <= lVar7) {
                return iVar3;
              }
              if (iVar3 == 0) {
                iVar3 = 0;
              }
              else {
                iVar3 = piVar2[lVar6 + lVar7 + 1];
                if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                iVar3 = Gia_ManMappingVerify_rec(p,p->pObjs + iVar3);
                pVVar4 = p->vMapping;
              }
              lVar7 = lVar7 + 1;
              uVar5 = pVVar4->nSize;
            } while ((int)uVar8 < (int)uVar5);
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      goto LAB_00213bed;
    }
  }
  return 1;
}

Assistant:

int Gia_ManMappingVerify_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Id, iFan, k, Result = 1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( !Gia_ObjIsAndNotBuf(pObj) )
        return 1;
    if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pObj)) )
    {
        Abc_Print( -1, "Gia_ManMappingVerify: Internal node %d does not have mapping.\n", Gia_ObjId(p, pObj) );
        return 0;
    }
    Id = Gia_ObjId(p, pObj);
    Gia_LutForEachFanin( p, Id, iFan, k )
        if ( Result )
            Result &= Gia_ManMappingVerify_rec( p, Gia_ManObj(p, iFan) );
    return Result;
}